

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

uintptr_t upb_Message_GetTaggedMessagePtr
                    (upb_Message *msg,upb_MiniTableField *f,upb_Message *default_val)

{
  byte bVar1;
  bool bVar2;
  upb_CType uVar3;
  upb_Message **from;
  uintptr_t tagged;
  uintptr_t local_20;
  upb_Message *local_18;
  
  local_18 = default_val;
  uVar3 = upb_MiniTableField_CType(f);
  if (uVar3 != kUpb_CType_Message) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x1bd,
                  "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                 );
  }
  bVar1 = f->mode_dont_copy_me__upb_internal_use_only;
  if (bVar1 < 0xc0) {
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x1bf,
                  "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                 );
  }
  if ((bVar1 & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x1c0,
                  "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                 );
  }
  if ((bVar1 & 8) != 0) {
    __assert_fail("!upb_MiniTableField_IsExtension(field)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x10d,
                  "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                 );
  }
  if (f->presence < 0) {
LAB_001534b7:
    bVar2 = upb_Message_HasBaseField(msg,f);
    if (!bVar2) {
      from = &local_18;
      goto LAB_001534e7;
    }
  }
  else {
    bVar2 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(f,&local_18);
    if (!bVar2) goto LAB_001534b7;
  }
  from = (upb_Message **)
         ((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only);
LAB_001534e7:
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&local_20,from);
  return local_20;
}

Assistant:

UPB_API_INLINE uintptr_t upb_Message_GetTaggedMessagePtr(
    const struct upb_Message* msg, const upb_MiniTableField* f,
    struct upb_Message* default_val) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Message);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) ==
             UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte));
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  uintptr_t tagged;
  _upb_Message_GetNonExtensionField(msg, f, &default_val, &tagged);
  return tagged;
}